

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_torn_write.cpp
# Opt level: O0

idx_t GetWALFileSize(FileSystem *fs,string *path)

{
  type pFVar1;
  idx_t iVar2;
  undefined8 in_RSI;
  long *in_RDI;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
  *in_stack_ffffffffffffff90;
  optional_ptr<duckdb::FileOpener,_true> local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_18 [16];
  long *local_8;
  
  local_28 = duckdb::FileFlags::FILE_FLAGS_READ;
  uStack_20 = _back;
  local_8 = in_RDI;
  duckdb::optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_30,(FileOpener *)0x0);
  (**(code **)(*in_RDI + 0x10))(local_18,in_RDI,in_RSI,local_28,uStack_20,local_30.ptr);
  pFVar1 = duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
           operator*(in_stack_ffffffffffffff90);
  iVar2 = (**(code **)(*local_8 + 0x40))(local_8,pFVar1);
  duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             0x7b14ba);
  return iVar2;
}

Assistant:

static idx_t GetWALFileSize(FileSystem &fs, const string &path) {
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_READ);
	return fs.GetFileSize(*handle);
}